

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_utils.cpp
# Opt level: O0

Loop * __thiscall
spvtools::opt::LoopUtils::CloneAndAttachLoopToHeader
          (LoopUtils *this,LoopCloningResult *cloning_result)

{
  IRContext *pIVar1;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> uVar2;
  bool bVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  Instruction *this_00;
  BasicBlock *pBVar6;
  pointer pBVar7;
  Function *function;
  reference this_01;
  anon_class_8_2_dc0ab79e this_02;
  DefUseManager *pDVar8;
  anon_class_16_2_5d4df5ce local_150;
  function<void_(spvtools::opt::Instruction_*,_unsigned_int)> local_140;
  anon_class_16_2_abcecdeb local_120;
  function<void_(spvtools::opt::Instruction_*,_unsigned_int)> local_110;
  DefUseManager *local_f0;
  DefUseManager *def_use;
  uint32_t new_header;
  uint32_t old_header;
  anon_class_8_2_dc0ab79e local_c0;
  anon_class_8_2_dc0ab79e replace_merge_use;
  Instruction *inst;
  iterator __end3;
  iterator __begin3;
  BasicBlock *__range3;
  unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
  *basic_block;
  iterator __end2;
  iterator __begin2;
  vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
  *__range2;
  uint32_t new_merge_block;
  uint32_t old_merge_block;
  InstructionBuilder builder;
  unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> local_48;
  unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> new_exit_bb
  ;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_28;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> new_label
  ;
  Loop *new_loop;
  LoopCloningResult *cloning_result_local;
  LoopUtils *this_local;
  
  new_label._M_t.
  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
       (__uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
        )CloneLoop(this,cloning_result);
  this_00 = (Instruction *)::operator_new(0x70);
  pIVar1 = this->context_;
  uVar4 = IRContext::TakeNextId(this->context_);
  memset(&new_exit_bb,0,0x18);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)&new_exit_bb
            );
  opt::Instruction::Instruction(this_00,pIVar1,OpLabel,0,uVar4,(OperandList *)&new_exit_bb);
  std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>::
  unique_ptr<std::default_delete<spvtools::opt::Instruction>,void>
            ((unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
              *)&local_28,this_00);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)&new_exit_bb
            );
  pBVar6 = (BasicBlock *)::operator_new(0x88);
  std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
  unique_ptr((unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
              *)&builder.preserved_analyses_,&local_28);
  BasicBlock::BasicBlock
            (pBVar6,(unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                     *)&builder.preserved_analyses_);
  std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>::
  unique_ptr<std::default_delete<spvtools::opt::BasicBlock>,void>
            ((unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>> *
             )&local_48,pBVar6);
  std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
  ~unique_ptr((unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
               *)&builder.preserved_analyses_);
  pBVar7 = std::
           unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
           operator->(&local_48);
  pBVar6 = Loop::GetMergeBlock(this->loop_);
  function = BasicBlock::GetParent(pBVar6);
  BasicBlock::SetParent(pBVar7,function);
  pIVar1 = this->context_;
  pBVar7 = std::
           unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
           get(&local_48);
  InstructionBuilder::InstructionBuilder
            ((InstructionBuilder *)&new_merge_block,pIVar1,pBVar7,kAnalysisNone);
  pBVar6 = Loop::GetHeaderBlock(this->loop_);
  uVar4 = BasicBlock::id(pBVar6);
  InstructionBuilder::AddBranch((InstructionBuilder *)&new_merge_block,uVar4);
  pBVar6 = Loop::GetMergeBlock(this->loop_);
  uVar4 = BasicBlock::id(pBVar6);
  pBVar7 = std::
           unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
           operator->(&local_48);
  uVar5 = BasicBlock::id(pBVar7);
  __end2 = std::
           vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
           ::begin(&cloning_result->cloned_bb_);
  basic_block = (unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                 *)std::
                   vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                   ::end(&cloning_result->cloned_bb_);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_*,_std::vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>_>
                                *)&basic_block);
    if (!bVar3) break;
    this_01 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_*,_std::vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>_>
              ::operator*(&__end2);
    std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
    operator*(this_01);
    BasicBlock::begin((BasicBlock *)&__end3);
    BasicBlock::end((BasicBlock *)&inst);
    while( true ) {
      bVar3 = utils::operator!=(&__end3.super_iterator,
                                (iterator_template<spvtools::opt::Instruction> *)&inst);
      if (!bVar3) break;
      this_02 = (anon_class_8_2_dc0ab79e)
                utils::IntrusiveList<spvtools::opt::Instruction>::
                iterator_template<spvtools::opt::Instruction>::operator*(&__end3.super_iterator);
      local_c0.old_merge_block = uVar4;
      local_c0.new_merge_block = uVar5;
      replace_merge_use = this_02;
      std::function<void(unsigned_int*)>::
      function<spvtools::opt::LoopUtils::CloneAndAttachLoopToHeader(spvtools::opt::LoopUtils::LoopCloningResult*)::__0&,void>
                ((function<void(unsigned_int*)> *)&new_header,&local_c0);
      opt::Instruction::ForEachInOperand
                ((Instruction *)this_02,(function<void_(unsigned_int_*)> *)&new_header);
      std::function<void_(unsigned_int_*)>::~function
                ((function<void_(unsigned_int_*)> *)&new_header);
      InstructionList::iterator::operator++(&__end3);
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_*,_std::vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>_>
    ::operator++(&__end2);
  }
  pBVar6 = Loop::GetHeaderBlock(this->loop_);
  def_use._4_4_ = BasicBlock::id(pBVar6);
  pBVar6 = Loop::GetHeaderBlock
                     ((Loop *)new_label._M_t.
                              super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                              .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                              _M_head_impl);
  def_use._0_4_ = BasicBlock::id(pBVar6);
  pDVar8 = IRContext::get_def_use_mgr(this->context_);
  uVar4 = def_use._4_4_;
  local_120.new_header = (uint32_t)def_use;
  local_120.this = this;
  local_f0 = pDVar8;
  std::function<void(spvtools::opt::Instruction*,unsigned_int)>::
  function<spvtools::opt::LoopUtils::CloneAndAttachLoopToHeader(spvtools::opt::LoopUtils::LoopCloningResult*)::__1,void>
            ((function<void(spvtools::opt::Instruction*,unsigned_int)> *)&local_110,&local_120);
  analysis::DefUseManager::ForEachUse(pDVar8,uVar4,&local_110);
  std::function<void_(spvtools::opt::Instruction_*,_unsigned_int)>::~function(&local_110);
  pDVar8 = local_f0;
  pBVar6 = Loop::GetOrCreatePreHeaderBlock(this->loop_);
  uVar4 = BasicBlock::id(pBVar6);
  local_150.new_merge_block = uVar5;
  local_150.this = this;
  std::function<void(spvtools::opt::Instruction*,unsigned_int)>::
  function<spvtools::opt::LoopUtils::CloneAndAttachLoopToHeader(spvtools::opt::LoopUtils::LoopCloningResult*)::__2,void>
            ((function<void(spvtools::opt::Instruction*,unsigned_int)> *)&local_140,&local_150);
  analysis::DefUseManager::ForEachUse(pDVar8,uVar4,&local_140);
  std::function<void_(spvtools::opt::Instruction_*,_unsigned_int)>::~function(&local_140);
  uVar2 = new_label;
  pBVar7 = std::
           unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
           get(&local_48);
  Loop::SetMergeBlock((Loop *)uVar2._M_t.
                              super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                              .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                              _M_head_impl,pBVar7);
  uVar2 = new_label;
  pBVar6 = Loop::GetPreHeaderBlock(this->loop_);
  Loop::SetPreHeaderBlock
            ((Loop *)uVar2._M_t.
                     super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                     .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl,pBVar6
            );
  std::
  vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
  ::push_back(&cloning_result->cloned_bb_,&local_48);
  uVar2 = new_label;
  std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
  ~unique_ptr(&local_48);
  std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
  ~unique_ptr(&local_28);
  return (Loop *)(__uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                  )uVar2._M_t.
                   super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                   .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
}

Assistant:

Loop* LoopUtils::CloneAndAttachLoopToHeader(LoopCloningResult* cloning_result) {
  // Clone the loop.
  Loop* new_loop = CloneLoop(cloning_result);

  // Create a new exit block/label for the new loop.
  // TODO(1841): Handle id overflow.
  std::unique_ptr<Instruction> new_label{new Instruction(
      context_, spv::Op::OpLabel, 0, context_->TakeNextId(), {})};
  std::unique_ptr<BasicBlock> new_exit_bb{new BasicBlock(std::move(new_label))};
  new_exit_bb->SetParent(loop_->GetMergeBlock()->GetParent());

  // Create an unconditional branch to the header block.
  InstructionBuilder builder{context_, new_exit_bb.get()};
  builder.AddBranch(loop_->GetHeaderBlock()->id());

  // Save the ids of the new and old merge block.
  const uint32_t old_merge_block = loop_->GetMergeBlock()->id();
  const uint32_t new_merge_block = new_exit_bb->id();

  // Replace the uses of the old merge block in the new loop with the new merge
  // block.
  for (std::unique_ptr<BasicBlock>& basic_block : cloning_result->cloned_bb_) {
    for (Instruction& inst : *basic_block) {
      // For each operand in each instruction check if it is using the old merge
      // block and change it to be the new merge block.
      auto replace_merge_use = [old_merge_block,
                                new_merge_block](uint32_t* id) {
        if (*id == old_merge_block) *id = new_merge_block;
      };
      inst.ForEachInOperand(replace_merge_use);
    }
  }

  const uint32_t old_header = loop_->GetHeaderBlock()->id();
  const uint32_t new_header = new_loop->GetHeaderBlock()->id();
  analysis::DefUseManager* def_use = context_->get_def_use_mgr();

  def_use->ForEachUse(old_header,
                      [new_header, this](Instruction* inst, uint32_t operand) {
                        if (!this->loop_->IsInsideLoop(inst))
                          inst->SetOperand(operand, {new_header});
                      });

  // TODO(1841): Handle failure to create pre-header.
  def_use->ForEachUse(
      loop_->GetOrCreatePreHeaderBlock()->id(),
      [new_merge_block, this](Instruction* inst, uint32_t operand) {
        if (this->loop_->IsInsideLoop(inst))
          inst->SetOperand(operand, {new_merge_block});

      });
  new_loop->SetMergeBlock(new_exit_bb.get());

  new_loop->SetPreHeaderBlock(loop_->GetPreHeaderBlock());

  // Add the new block into the cloned instructions.
  cloning_result->cloned_bb_.push_back(std::move(new_exit_bb));

  return new_loop;
}